

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

LY_ERR lyd_validate_module(lyd_node **tree,lys_module *module,uint32_t val_opts,lyd_node **diff)

{
  lyd_node *plVar1;
  lysc_node *plVar2;
  ly_ctx *plVar3;
  LY_ERR LVar4;
  lys_module *plVar5;
  char *pcVar6;
  
  if (tree == (lyd_node **)0x0) {
    pcVar6 = "tree";
  }
  else if (module == (lys_module *)0x0) {
    pcVar6 = "module";
  }
  else {
    if ((val_opts & 2) == 0) {
      plVar1 = *tree;
      if (plVar1 != (lyd_node *)0x0) {
        plVar2 = plVar1->schema;
        if (plVar2 == (lysc_node *)0x0) {
          plVar3 = (ly_ctx *)plVar1[2].schema;
        }
        else {
          plVar3 = plVar2->module->ctx;
        }
        if ((plVar3 != (ly_ctx *)0x0) && (module->ctx != (ly_ctx *)0x0)) {
          if (plVar2 == (lysc_node *)0x0) {
            plVar5 = (lys_module *)&plVar1[2].schema;
          }
          else {
            plVar5 = plVar2->module;
          }
          if (plVar5->ctx != module->ctx) {
            if (plVar2 == (lysc_node *)0x0) {
              plVar5 = (lys_module *)&plVar1[2].schema;
            }
            else {
              plVar5 = plVar2->module;
            }
            ly_log(plVar5->ctx,LY_LLERR,LY_EINVAL,
                   "Different contexts mixed in a single function call.");
            return LY_EINVAL;
          }
        }
      }
      if (diff != (lyd_node **)0x0) {
        *diff = (lyd_node *)0x0;
      }
      LVar4 = lyd_validate(tree,module,module->ctx,val_opts,'\x01',(ly_set *)0x0,(ly_set *)0x0,
                           (ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,diff);
      return LVar4;
    }
    pcVar6 = "!(val_opts & 0x0002)";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar6,"lyd_validate_module"
        );
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_validate_module(struct lyd_node **tree, const struct lys_module *module, uint32_t val_opts, struct lyd_node **diff)
{
    LY_CHECK_ARG_RET(NULL, tree, module, !(val_opts & LYD_VALIDATE_PRESENT), LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(*tree ? LYD_CTX(*tree) : NULL, module->ctx, LY_EINVAL);
    if (diff) {
        *diff = NULL;
    }

    return lyd_validate(tree, module, module->ctx, val_opts, 1, NULL, NULL, NULL, NULL, NULL, diff);
}